

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_extDict_6
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  size_t sVar1;
  U32 in_stack_000002fc;
  size_t in_stack_00000300;
  void *in_stack_00000308;
  U32 *in_stack_00000310;
  seqStore_t *in_stack_00000318;
  ZSTD_matchState_t *in_stack_00000320;
  
  sVar1 = ZSTD_compressBlock_doubleFast_extDict_generic
                    (in_stack_00000320,in_stack_00000318,in_stack_00000310,in_stack_00000308,
                     in_stack_00000300,in_stack_000002fc);
  return sVar1;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_extDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_extDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_extDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_extDict_7(ms, seqStore, rep, src, srcSize);
    }
}